

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::ConstantAffixModifier::semanticallyEquivalent
          (ConstantAffixModifier *this,Modifier *other)

{
  UBool UVar1;
  bool local_41;
  long local_40;
  ConstantAffixModifier *_other;
  Modifier *other_local;
  ConstantAffixModifier *this_local;
  
  if (other == (Modifier *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    UVar1 = UnicodeString::operator==(&this->fPrefix,(UnicodeString *)(local_40 + 0x10));
    local_41 = false;
    if (UVar1 != '\0') {
      UVar1 = UnicodeString::operator==(&this->fSuffix,(UnicodeString *)(local_40 + 0x50));
      local_41 = false;
      if ((UVar1 != '\0') && (local_41 = false, this->fField == *(Field *)(local_40 + 0x90))) {
        local_41 = (this->fStrong & 1U) == (*(byte *)(local_40 + 0x94) & 1);
      }
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

bool ConstantAffixModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const ConstantAffixModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    return fPrefix == _other->fPrefix
        && fSuffix == _other->fSuffix
        && fField == _other->fField
        && fStrong == _other->fStrong;
}